

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_window_title.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  uint uVar10;
  ALLEGRO_EVENT event;
  char title [256];
  int local_180;
  int local_160;
  char local_138 [264];
  
  memset(local_138,0,0x100);
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    pcVar5 = "Failed to init Allegro.\n";
  }
  else {
    cVar1 = al_init_image_addon();
    if (cVar1 == '\0') {
      pcVar5 = "Failed to init IIO addon.\n";
    }
    else {
      al_init_font_addon();
      al_set_new_window_title("A Custom Window Title. Press space to start changing it.");
      lVar3 = al_create_display(0x280,0x1e0);
      if (lVar3 == 0) {
        pcVar5 = "Error creating display.\n";
      }
      else {
        cVar1 = al_install_keyboard();
        if (cVar1 == '\0') {
          pcVar5 = "Error installing keyboard.\n";
        }
        else {
          lVar4 = al_load_font("data/fixed_font.tga",0,0);
          if (lVar4 != 0) {
            pcVar5 = (char *)al_get_new_window_title();
            uVar6 = al_create_timer(0x3ff0000000000000);
            uVar7 = al_create_event_queue();
            uVar8 = al_get_keyboard_event_source();
            al_register_event_source(uVar7,uVar8);
            uVar8 = al_get_timer_event_source(uVar6);
            al_register_event_source(uVar7,uVar8);
            uVar8 = al_get_display_event_source(lVar3);
            al_register_event_source(uVar7,uVar8);
            bVar9 = true;
            uVar10 = 0;
            do {
              while( true ) {
                while( true ) {
                  if (bVar9) {
                    cVar1 = al_is_event_queue_empty(uVar7);
                    bVar9 = true;
                    if (cVar1 != '\0') {
                      al_map_rgb_f(0,0,0);
                      al_clear_to_color();
                      al_map_rgba_f();
                      bVar9 = false;
                      al_draw_text(lVar4,0,pcVar5);
                      al_flip_display();
                    }
                  }
                  else {
                    bVar9 = false;
                  }
                  al_wait_for_event(uVar7);
                  if (local_180 == 10) break;
                  if (local_180 == 0x1e) {
                    uVar10 = uVar10 + 1;
                    sprintf(local_138,"Title: %d",(ulong)uVar10);
                    al_set_window_title(lVar3);
                    bVar9 = true;
                    pcVar5 = local_138;
                  }
                  else if (local_180 == 0x2a) {
                    return 0;
                  }
                }
                if (local_160 != 0x4b) break;
                al_start_timer(uVar6);
              }
            } while (local_160 != 0x3b);
            return 0;
          }
          pcVar5 = "Error loading data/fixed_font.tga\n";
        }
      }
    }
  }
  abort_example(pcVar5);
  iVar2 = __cxa_atexit();
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_FONT *font;
   int step = 0;
   const char *text;
   char   title[TITLE_SIZE] = "";
   bool done = false;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_font_addon();
   init_platform_specific();

   text = NEW_WINDOW_TITLE;

   al_set_new_window_title(NEW_WINDOW_TITLE);

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   font = al_load_font("data/fixed_font.tga", 0, 0);
   if (!font) {
      abort_example("Error loading data/fixed_font.tga\n");
   }

   text = al_get_new_window_title();

   timer = al_create_timer(INTERVAL);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_register_event_source(queue, al_get_display_event_source(display));



   while (!done) {
      ALLEGRO_EVENT event;

      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgb_f(0, 0, 0));
         al_draw_text(font, al_map_rgba_f(1, 1, 1, 0.5), 0, 0, 0, text);
         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
               done = true;
            else if (event.keyboard.keycode == ALLEGRO_KEY_SPACE)
               al_start_timer(timer);
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;

         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            step++;
            sprintf(title, "Title: %d", step);
            text = title;
            al_set_window_title(display, title);
            break;
      }
   }

   return 0;
}